

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O1

iDynTree * __thiscall
iDynTree::boxGet6DInertiaInLinkFrameFromDensity(iDynTree *this,Box *box,double density)

{
  SpatialInertia *pSVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Position comInGeomFrame;
  RotationalInertia rotInertiaInGeomFrame;
  SpatialInertia inertiaInGeometryFrame;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  double local_d8 [9];
  SpatialInertia local_90 [104];
  
  dVar2 = (double)iDynTree::Box::getX();
  dVar3 = (double)iDynTree::Box::getY();
  dVar4 = (double)iDynTree::Box::getZ();
  dVar2 = dVar4 * dVar3 * dVar2 * density;
  iDynTree::Position::Position((Position *)&local_f8);
  local_e8 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  iDynTree::RotationalInertia::RotationalInertia((RotationalInertia *)local_d8);
  local_d8[8] = 0.0;
  local_d8[6] = 0.0;
  local_d8[7] = 0.0;
  local_d8[4] = 0.0;
  local_d8[5] = 0.0;
  local_d8[2] = 0.0;
  local_d8[3] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  dVar3 = (double)iDynTree::Box::getX();
  dVar4 = (double)iDynTree::Box::getX();
  dVar5 = (double)iDynTree::Box::getY();
  dVar6 = (double)iDynTree::Box::getY();
  dVar7 = (double)iDynTree::Box::getZ();
  dVar8 = (double)iDynTree::Box::getZ();
  local_d8[8] = dVar2 / 12.0;
  local_d8[0] = (dVar6 * dVar5 + dVar8 * dVar7) * local_d8[8];
  local_d8[4] = (dVar8 * dVar7 + dVar4 * dVar3) * local_d8[8];
  local_d8[8] = (dVar6 * dVar5 + dVar4 * dVar3) * local_d8[8];
  iDynTree::SpatialInertia::SpatialInertia
            (local_90,dVar2,(Position *)&local_f8,(RotationalInertia *)local_d8);
  pSVar1 = (SpatialInertia *)iDynTree::SolidShape::getLink_H_geometry();
  iDynTree::Transform::operator*((Transform *)this,pSVar1);
  return this;
}

Assistant:

SpatialInertia boxGet6DInertiaInLinkFrameFromDensity(const Box& box,
                                                     double density)
{
    double boxVolume = box.getX() * box.getY() * box.getZ();
    double boxMass   = density*boxVolume;
    // Assuming uniform density, the center of mass is coincident with the box center
    Position comInGeomFrame;
    comInGeomFrame.zero();
    // From http://scienceworld.wolfram.com/physics/MomentofInertiaRectangularParallelepiped.html
    RotationalInertia rotInertiaInGeomFrame;
    rotInertiaInGeomFrame.zero();
    double x2 = box.getX() * box.getX();
    double y2 = box.getY() * box.getY();
    double z2 = box.getZ() * box.getZ();
    rotInertiaInGeomFrame(0, 0) = (boxMass/12.0)*(y2+z2);
    rotInertiaInGeomFrame(1, 1) = (boxMass/12.0)*(x2+z2);
    rotInertiaInGeomFrame(2, 2) = (boxMass/12.0)*(x2+y2);

    SpatialInertia inertiaInGeometryFrame = SpatialInertia(boxMass, comInGeomFrame, rotInertiaInGeomFrame);

    return box.getLink_H_geometry() * inertiaInGeometryFrame;
}